

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::AddKel
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *elmat
          ,TPZVec<long> *source,TPZVec<long> *destinationindex)

{
  int64_t iVar1;
  long lVar2;
  int64_t iVar3;
  int iVar4;
  complex<long_double> *pcVar5;
  long lVar6;
  long lVar7;
  longdouble lVar8;
  longdouble lVar9;
  complex<long_double> prevval;
  undefined8 local_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  undefined8 local_88;
  undefined2 uStack_80;
  undefined6 uStack_7e;
  long local_78;
  long local_70;
  TPZFMatrix<std::complex<long_double>_> *local_68;
  long local_60;
  undefined8 local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar6 = source->fNElements;
  local_98 = SUB108((longdouble)0,0);
  uStack_90 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
  local_88 = local_98;
  uStack_80 = uStack_90;
  local_68 = elmat;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_70 = 0;
  if (0 < lVar6) {
    local_70 = lVar6;
  }
  local_60 = lVar6;
  if (iVar4 == 0) {
    for (local_78 = 0; local_78 != local_70; local_78 = local_78 + 1) {
      lVar6 = destinationindex->fStore[local_78];
      iVar1 = source->fStore[local_78];
      for (lVar7 = 0; local_60 != lVar7; lVar7 = lVar7 + 1) {
        lVar2 = destinationindex->fStore[lVar7];
        iVar3 = source->fStore[lVar7];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_58,this,lVar6,lVar2);
        local_88 = local_48;
        uStack_80 = (undefined2)uStack_40;
        uStack_7e = (undefined6)((ulong)uStack_40 >> 0x10);
        local_98 = local_58[0];
        uStack_90 = (undefined2)local_58[1];
        uStack_8e = (undefined6)((ulong)local_58[1] >> 0x10);
        pcVar5 = TPZFMatrix<std::complex<long_double>_>::operator()(local_68,iVar1,iVar3);
        lVar9 = (longdouble)CONCAT28(uStack_90,local_98) + *(longdouble *)pcVar5->_M_value;
        lVar8 = (longdouble)CONCAT28(uStack_80,local_88) + *(longdouble *)(pcVar5->_M_value + 0x10);
        local_98 = SUB108(lVar9,0);
        uStack_90 = (undefined2)((unkuint10)lVar9 >> 0x40);
        local_88 = SUB108(lVar8,0);
        uStack_80 = (undefined2)((unkuint10)lVar8 >> 0x40);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar2,&local_98);
      }
    }
  }
  else {
    lVar6 = 0;
    while (lVar6 != local_70) {
      lVar7 = destinationindex->fStore[lVar6];
      iVar1 = source->fStore[lVar6];
      local_78 = lVar6;
      for (; local_60 != lVar6; lVar6 = lVar6 + 1) {
        lVar2 = destinationindex->fStore[lVar6];
        iVar3 = source->fStore[lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_58,this,lVar7,lVar2);
        local_88 = local_48;
        uStack_80 = (undefined2)uStack_40;
        uStack_7e = (undefined6)((ulong)uStack_40 >> 0x10);
        local_98 = local_58[0];
        uStack_90 = (undefined2)local_58[1];
        uStack_8e = (undefined6)((ulong)local_58[1] >> 0x10);
        pcVar5 = TPZFMatrix<std::complex<long_double>_>::operator()(local_68,iVar1,iVar3);
        lVar9 = (longdouble)CONCAT28(uStack_90,local_98) + *(longdouble *)pcVar5->_M_value;
        lVar8 = (longdouble)CONCAT28(uStack_80,local_88) + *(longdouble *)(pcVar5->_M_value + 0x10);
        local_98 = SUB108(lVar9,0);
        uStack_90 = (undefined2)((unkuint10)lVar9 >> 0x40);
        local_88 = SUB108(lVar8,0);
        uStack_80 = (undefined2)((unkuint10)lVar8 >> 0x40);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar2,&local_98);
      }
      lVar6 = local_78 + 1;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}